

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::Option::transform
          (Option *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *func,string *transform_description,string *transform_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator __position;
  string local_110;
  string local_f0;
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data *local_50;
  _Any_data local_40;
  
  __position._M_current =
       (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_b0,func);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Option::transform(std::function<std::__cxx11::string(std::__cxx11::string)>const&,std::__cxx11::string,std::__cxx11::string)::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)local_d0._M_pod_data,
             (anon_class_32_1_898bcfc2 *)&local_b0);
  local_110._M_dataplus._M_p = (transform_description->_M_dataplus)._M_p;
  paVar1 = &transform_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == paVar1) {
    local_110.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_110.field_2._8_8_ = *(undefined8 *)((long)&transform_description->field_2 + 8);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_110._M_string_length = transform_description->_M_string_length;
  (transform_description->_M_dataplus)._M_p = (pointer)paVar1;
  transform_description->_M_string_length = 0;
  (transform_description->field_2)._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (transform_name->_M_dataplus)._M_p;
  paVar1 = &transform_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar1) {
    local_f0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&transform_name->field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_f0._M_string_length = transform_name->_M_string_length;
  (transform_name->_M_dataplus)._M_p = (pointer)paVar1;
  transform_name->_M_string_length = 0;
  (transform_name->field_2)._M_local_buf[0] = '\0';
  Validator::Validator
            ((Validator *)&local_90,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_d0,&local_110,&local_f0);
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&this->validators_,__position,(value_type *)&local_90);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_unused._M_member_pointer + 1);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  return this;
}

Assistant:

CLI11_INLINE Option *Option::transform(const std::function<std::string(std::string)> &func,
                                       std::string transform_description,
                                       std::string transform_name) {
    validators_.insert(validators_.begin(),
                       Validator(
                           [func](std::string &val) {
                               val = func(val);
                               return std::string{};
                           },
                           std::move(transform_description),
                           std::move(transform_name)));

    return this;
}